

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O3

void __thiscall
pele::physics::reactions::ReactorArkode::print_final_stats(ReactorArkode *this,void *arkode_mem)

{
  ostringstream *poVar1;
  char *funcname;
  long nfe;
  long netf;
  long nst_a;
  long nst;
  long nfi;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  Print local_198;
  
  if (this->use_erkstep == 0) {
    local_1c4 = ARKStepGetNumSteps(arkode_mem,&local_1a8);
    utils::check_flag(&local_1c4,"ARKStepGetNumSteps",1);
    local_1c4 = ARKStepGetNumStepAttempts(arkode_mem,&local_1b0);
    utils::check_flag(&local_1c4,"ARKStepGetNumStepAttempts",1);
    local_1c4 = ARKStepGetNumErrTestFails(arkode_mem,&local_1b8);
    utils::check_flag(&local_1c4,"ARKStepGetNumErrTestFails",1);
    local_1c4 = ARKStepGetNumRhsEvals(arkode_mem,&local_1c0,&local_1a0);
    funcname = "ARKStepGetNumRhsEvals";
  }
  else {
    local_1c4 = ERKStepGetNumSteps(arkode_mem,&local_1a8);
    utils::check_flag(&local_1c4,"ERKStepGetNumSteps",1);
    local_1c4 = ERKStepGetNumStepAttempts(arkode_mem,&local_1b0);
    utils::check_flag(&local_1c4,"ERKStepGetNumStepAttempts",1);
    local_1c4 = ERKStepGetNumErrTestFails(arkode_mem,&local_1b8);
    utils::check_flag(&local_1c4,"ERKStepGetNumErrTestFails",1);
    local_1c4 = ERKStepGetNumRhsEvals(arkode_mem,&local_1c0);
    funcname = "ERKStepGetNumRhsEvals";
  }
  utils::check_flag(&local_1c4,funcname,1);
  local_198.os = amrex::OutStream();
  local_198.rank = *(int *)(DAT_00816950 + -0x30);
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.ss);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198.ss,"\nFinal Statistics:\n",0x13);
  amrex::Print::~Print(&local_198);
  local_198.os = amrex::OutStream();
  local_198.rank = *(int *)(DAT_00816950 + -0x30);
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  poVar1 = &local_198.ss;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"   Internal steps   = ",0x16);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  amrex::Print::~Print(&local_198);
  local_198.os = amrex::OutStream();
  local_198.rank = *(int *)(DAT_00816950 + -0x30);
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  poVar1 = &local_198.ss;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"   Attempted steps  = ",0x16);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  amrex::Print::~Print(&local_198);
  local_198.os = amrex::OutStream();
  local_198.rank = *(int *)(DAT_00816950 + -0x30);
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  poVar1 = &local_198.ss;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"   Error test fails = ",0x16);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  amrex::Print::~Print(&local_198);
  local_198.os = amrex::OutStream();
  local_198.rank = *(int *)(DAT_00816950 + -0x30);
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  poVar1 = &local_198.ss;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"   Total RHS evals  = ",0x16);
  std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  amrex::Print::~Print(&local_198);
  return;
}

Assistant:

void
ReactorArkode::print_final_stats(void* arkode_mem)
{
  long int nst, nst_a, netf, nfe, nfi;
  int flag;

  if (use_erkstep != 0) {
    flag = ERKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ERKStepGetNumSteps", 1);
    flag = ERKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ERKStepGetNumStepAttempts", 1);
    flag = ERKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ERKStepGetNumErrTestFails", 1);
    flag = ERKStepGetNumRhsEvals(arkode_mem, &nfe);
    utils::check_flag(&flag, "ERKStepGetNumRhsEvals", 1);

  } else {
    flag = ARKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ARKStepGetNumSteps", 1);
    flag = ARKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ARKStepGetNumStepAttempts", 1);
    flag = ARKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ARKStepGetNumErrTestFails", 1);
    flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
    utils::check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  }

#ifdef AMREX_USE_OMP
  amrex::Print() << "\nFinal Statistics: "
                 << "(thread:" << omp_get_thread_num() << ", ";
  amrex::Print() << "arkodeMem:" << arkode_mem << ")\n";
#else
  amrex::Print() << "\nFinal Statistics:\n";
#endif

  amrex::Print() << "   Internal steps   = " << nst << "\n";
  amrex::Print() << "   Attempted steps  = " << nst_a << "\n";
  amrex::Print() << "   Error test fails = " << netf << "\n";
  amrex::Print() << "   Total RHS evals  = " << nfe << "\n";
}